

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTest.cxx
# Opt level: O0

cmValue __thiscall cmTest::GetProperty(cmTest *this,string *prop)

{
  bool bVar1;
  cmState *this_00;
  cmValue cStack_28;
  bool chain;
  cmValue retVal;
  string *prop_local;
  cmTest *this_local;
  cmValue p;
  
  retVal.Value = prop;
  cStack_28 = cmPropertyMap::GetPropertyValue(&this->Properties,prop);
  bVar1 = cmValue::operator_cast_to_bool(&stack0xffffffffffffffd8);
  if (bVar1) {
    this_local = (cmTest *)cStack_28.Value;
  }
  else {
    this_00 = cmMakefile::GetState(this->Makefile);
    bVar1 = cmState::IsPropertyChained(this_00,retVal.Value,TEST);
    if (bVar1) {
      this_local = (cmTest *)cmMakefile::GetProperty(this->Makefile,retVal.Value,bVar1);
      bVar1 = cmValue::operator_cast_to_bool((cmValue *)&this_local);
      if (bVar1) {
        return (cmValue)(string *)this_local;
      }
    }
    cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
  }
  return (cmValue)(string *)this_local;
}

Assistant:

cmValue cmTest::GetProperty(const std::string& prop) const
{
  cmValue retVal = this->Properties.GetPropertyValue(prop);
  if (!retVal) {
    const bool chain =
      this->Makefile->GetState()->IsPropertyChained(prop, cmProperty::TEST);
    if (chain) {
      if (cmValue p = this->Makefile->GetProperty(prop, chain)) {
        return p;
      }
    }
    return nullptr;
  }
  return retVal;
}